

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imap.c
# Opt level: O0

CURLcode imap_dophase_done(connectdata *conn,_Bool connected)

{
  IMAP *imap;
  _Bool connected_local;
  connectdata *conn_local;
  
  if (*(conn->data->req).protop != 0) {
    Curl_setup_transfer(conn->data,-1,-1,false,-1);
  }
  return CURLE_OK;
}

Assistant:

static CURLcode imap_dophase_done(struct connectdata *conn, bool connected)
{
  struct IMAP *imap = conn->data->req.protop;

  (void)connected;

  if(imap->transfer != FTPTRANSFER_BODY)
    /* no data to transfer */
    Curl_setup_transfer(conn->data, -1, -1, FALSE, -1);

  return CURLE_OK;
}